

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_setglobals_unittest.cc
# Opt level: O3

int main(int argc,char **argv)

{
  pointer pp_Var1;
  
  pp_Var1 = g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
      super__Vector_impl_data._M_start !=
      g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      (**pp_Var1)();
      pp_Var1 = pp_Var1 + 1;
    } while (pp_Var1 !=
             g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  fprintf(_stderr,"\nPassed %d tests\n\nPASS\n",
          (ulong)((long)pp_Var1 -
                 (long)g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>.
                       _M_impl.super__Vector_impl_data._M_start) >> 3 & 0xffffffff);
  return 0;
}

Assistant:

int main(int argc, char **argv) {

  return RUN_ALL_TESTS();
}